

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftpproto.c
# Opt level: O1

void do_site_chmod(session_t *sess,char *chmod_arg)

{
  uint __mode;
  int iVar1;
  char *text;
  char file [100];
  char perms [100];
  char local_e8 [112];
  char local_78 [104];
  
  if (*chmod_arg != '\0') {
    local_78[0x60] = '\0';
    local_78[0x61] = '\0';
    local_78[0x62] = '\0';
    local_78[99] = '\0';
    local_78[0x50] = '\0';
    local_78[0x51] = '\0';
    local_78[0x52] = '\0';
    local_78[0x53] = '\0';
    local_78[0x54] = '\0';
    local_78[0x55] = '\0';
    local_78[0x56] = '\0';
    local_78[0x57] = '\0';
    local_78[0x58] = '\0';
    local_78[0x59] = '\0';
    local_78[0x5a] = '\0';
    local_78[0x5b] = '\0';
    local_78[0x5c] = '\0';
    local_78[0x5d] = '\0';
    local_78[0x5e] = '\0';
    local_78[0x5f] = '\0';
    local_78[0x40] = '\0';
    local_78[0x41] = '\0';
    local_78[0x42] = '\0';
    local_78[0x43] = '\0';
    local_78[0x44] = '\0';
    local_78[0x45] = '\0';
    local_78[0x46] = '\0';
    local_78[0x47] = '\0';
    local_78[0x48] = '\0';
    local_78[0x49] = '\0';
    local_78[0x4a] = '\0';
    local_78[0x4b] = '\0';
    local_78[0x4c] = '\0';
    local_78[0x4d] = '\0';
    local_78[0x4e] = '\0';
    local_78[0x4f] = '\0';
    local_78[0x30] = '\0';
    local_78[0x31] = '\0';
    local_78[0x32] = '\0';
    local_78[0x33] = '\0';
    local_78[0x34] = '\0';
    local_78[0x35] = '\0';
    local_78[0x36] = '\0';
    local_78[0x37] = '\0';
    local_78[0x38] = '\0';
    local_78[0x39] = '\0';
    local_78[0x3a] = '\0';
    local_78[0x3b] = '\0';
    local_78[0x3c] = '\0';
    local_78[0x3d] = '\0';
    local_78[0x3e] = '\0';
    local_78[0x3f] = '\0';
    local_78[0x20] = '\0';
    local_78[0x21] = '\0';
    local_78[0x22] = '\0';
    local_78[0x23] = '\0';
    local_78[0x24] = '\0';
    local_78[0x25] = '\0';
    local_78[0x26] = '\0';
    local_78[0x27] = '\0';
    local_78[0x28] = '\0';
    local_78[0x29] = '\0';
    local_78[0x2a] = '\0';
    local_78[0x2b] = '\0';
    local_78[0x2c] = '\0';
    local_78[0x2d] = '\0';
    local_78[0x2e] = '\0';
    local_78[0x2f] = '\0';
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    local_78[0x18] = '\0';
    local_78[0x19] = '\0';
    local_78[0x1a] = '\0';
    local_78[0x1b] = '\0';
    local_78[0x1c] = '\0';
    local_78[0x1d] = '\0';
    local_78[0x1e] = '\0';
    local_78[0x1f] = '\0';
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = '\0';
    local_78[9] = '\0';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    local_e8[0x60] = '\0';
    local_e8[0x61] = '\0';
    local_e8[0x62] = '\0';
    local_e8[99] = '\0';
    local_e8[0x50] = '\0';
    local_e8[0x51] = '\0';
    local_e8[0x52] = '\0';
    local_e8[0x53] = '\0';
    local_e8[0x54] = '\0';
    local_e8[0x55] = '\0';
    local_e8[0x56] = '\0';
    local_e8[0x57] = '\0';
    local_e8[0x58] = '\0';
    local_e8[0x59] = '\0';
    local_e8[0x5a] = '\0';
    local_e8[0x5b] = '\0';
    local_e8[0x5c] = '\0';
    local_e8[0x5d] = '\0';
    local_e8[0x5e] = '\0';
    local_e8[0x5f] = '\0';
    local_e8[0x40] = '\0';
    local_e8[0x41] = '\0';
    local_e8[0x42] = '\0';
    local_e8[0x43] = '\0';
    local_e8[0x44] = '\0';
    local_e8[0x45] = '\0';
    local_e8[0x46] = '\0';
    local_e8[0x47] = '\0';
    local_e8[0x48] = '\0';
    local_e8[0x49] = '\0';
    local_e8[0x4a] = '\0';
    local_e8[0x4b] = '\0';
    local_e8[0x4c] = '\0';
    local_e8[0x4d] = '\0';
    local_e8[0x4e] = '\0';
    local_e8[0x4f] = '\0';
    local_e8[0x30] = '\0';
    local_e8[0x31] = '\0';
    local_e8[0x32] = '\0';
    local_e8[0x33] = '\0';
    local_e8[0x34] = '\0';
    local_e8[0x35] = '\0';
    local_e8[0x36] = '\0';
    local_e8[0x37] = '\0';
    local_e8[0x38] = '\0';
    local_e8[0x39] = '\0';
    local_e8[0x3a] = '\0';
    local_e8[0x3b] = '\0';
    local_e8[0x3c] = '\0';
    local_e8[0x3d] = '\0';
    local_e8[0x3e] = '\0';
    local_e8[0x3f] = '\0';
    local_e8[0x20] = '\0';
    local_e8[0x21] = '\0';
    local_e8[0x22] = '\0';
    local_e8[0x23] = '\0';
    local_e8[0x24] = '\0';
    local_e8[0x25] = '\0';
    local_e8[0x26] = '\0';
    local_e8[0x27] = '\0';
    local_e8[0x28] = '\0';
    local_e8[0x29] = '\0';
    local_e8[0x2a] = '\0';
    local_e8[0x2b] = '\0';
    local_e8[0x2c] = '\0';
    local_e8[0x2d] = '\0';
    local_e8[0x2e] = '\0';
    local_e8[0x2f] = '\0';
    local_e8[0x10] = '\0';
    local_e8[0x11] = '\0';
    local_e8[0x12] = '\0';
    local_e8[0x13] = '\0';
    local_e8[0x14] = '\0';
    local_e8[0x15] = '\0';
    local_e8[0x16] = '\0';
    local_e8[0x17] = '\0';
    local_e8[0x18] = '\0';
    local_e8[0x19] = '\0';
    local_e8[0x1a] = '\0';
    local_e8[0x1b] = '\0';
    local_e8[0x1c] = '\0';
    local_e8[0x1d] = '\0';
    local_e8[0x1e] = '\0';
    local_e8[0x1f] = '\0';
    local_e8[0] = '\0';
    local_e8[1] = '\0';
    local_e8[2] = '\0';
    local_e8[3] = '\0';
    local_e8[4] = '\0';
    local_e8[5] = '\0';
    local_e8[6] = '\0';
    local_e8[7] = '\0';
    local_e8[8] = '\0';
    local_e8[9] = '\0';
    local_e8[10] = '\0';
    local_e8[0xb] = '\0';
    local_e8[0xc] = '\0';
    local_e8[0xd] = '\0';
    local_e8[0xe] = '\0';
    local_e8[0xf] = '\0';
    str_split(chmod_arg,local_78,local_e8,' ');
    if (local_e8[0] == '\0') {
      text = "SITE CHMOD needs 2 arguments.";
      iVar1 = 500;
    }
    else {
      __mode = str_octal_to_uint(local_78);
      iVar1 = chmod(local_e8,__mode);
      if (iVar1 < 0) {
        text = "SITE CHMOD failed.";
        iVar1 = 0x1f8;
      }
      else {
        text = "SITE CHMOD ok.";
        iVar1 = 200;
      }
    }
    ftp_relply(sess,iVar1,text);
    return;
  }
  ftp_relply(sess,500,"SITE CHMOD needs 2 arguments.");
  return;
}

Assistant:

void do_site_chmod(session_t *sess, char *chmod_arg) {
  // chmod <param> <file>
  if (strlen(chmod_arg) == 0) {
    ftp_relply(sess, FTP_BADCMD, "SITE CHMOD needs 2 arguments.");
    return;
  }
  char perms[100] = {0};
  char file[100] = {0};

  str_split(chmod_arg, perms, file, ' ');
  if (strlen(file) == 0) {
    ftp_relply(sess, FTP_BADCMD, "SITE CHMOD needs 2 arguments.");
    return;
  }

  unsigned int mode = str_octal_to_uint(perms);
  if (chmod(file, mode) < 0) {
    ftp_relply(sess, FTP_BADMODE, "SITE CHMOD failed.");
  } else {
    ftp_relply(sess, FTP_CHMODOK, "SITE CHMOD ok.");
  }
}